

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double normal_truncated_ab_sample(double mu,double s,double a,double b,int *seed)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double xi_cdf;
  double xi;
  double x;
  double u;
  double beta_cdf;
  double beta;
  double alpha_cdf;
  double alpha;
  int *seed_local;
  double b_local;
  double a_local;
  double s_local;
  double mu_local;
  
  dVar1 = normal_01_cdf((a - mu) / s);
  dVar2 = normal_01_cdf((b - mu) / s);
  dVar3 = r8_uniform_01(seed);
  dVar1 = normal_01_cdf_inv(dVar3 * (dVar2 - dVar1) + dVar1);
  return s * dVar1 + mu;
}

Assistant:

double normal_truncated_ab_sample ( double mu, double s, double a, double b, 
  int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_TRUNCATED_AB_SAMPLE samples the truncated Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double MU, S, the mean and standard deviation of the
//    parent Normal distribution.
//
//    Input, double A, B, the lower and upper truncation limits.
//
//    Input/output, int &SEED, a seed for the random number
//    generator.
//
//    Output, double NORMAL_TRUNCATED_AB_SAMPLE, a sample of the PDF.
//
{
  double alpha;
  double alpha_cdf;
  double beta;
  double beta_cdf;
  double u;
  double x;
  double xi;
  double xi_cdf;

  alpha = ( a - mu ) / s;
  beta = ( b - mu ) / s;

  alpha_cdf = normal_01_cdf ( alpha );
  beta_cdf = normal_01_cdf ( beta );

  u = r8_uniform_01 ( seed );
  xi_cdf = alpha_cdf + u * ( beta_cdf - alpha_cdf );
  xi = normal_01_cdf_inv ( xi_cdf );

  x = mu + s * xi;

  return x;
}